

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-coroutine-test.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_0::simpleCoroutine<void>
          (anon_unknown_0 *this,Promise<void> *result,Promise<bool> *dontThrow)

{
  Coroutine<void> *this_00;
  PromiseAwaiter<bool> *__return_storage_ptr__;
  PromiseAwaiter<void> *__return_storage_ptr___00;
  SourceLocation location;
  bool bVar1;
  coroutine_handle<void> coroutine;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  Fault local_50;
  DebugExpression<bool_&> local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  coroutine._M_fr_ptr = operator_new(0x5c0);
  *(code **)coroutine._M_fr_ptr = simpleCoroutine<void>;
  *(code **)((long)coroutine._M_fr_ptr + 8) = simpleCoroutine<void>;
  this_00 = (Coroutine<void> *)((long)coroutine._M_fr_ptr + 0x10);
  *(PromiseNode **)((long)coroutine._M_fr_ptr + 0x5a8) = (result->super_PromiseBase).node.ptr;
  (result->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  *(PromiseNode **)((long)coroutine._M_fr_ptr + 0x5b0) = (dontThrow->super_PromiseBase).node.ptr;
  (dontThrow->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  local_48.value = (bool *)0x49adc4;
  pcStack_40 = "simpleCoroutine";
  local_38 = 0xc00000035;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00609238;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_00609280;
  location.function = "simpleCoroutine";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++"
  ;
  location.lineNumber = 0x35;
  location.columnNumber = 0xc;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  __return_storage_ptr__ = (PromiseAwaiter<bool> *)((long)coroutine._M_fr_ptr + 0x238);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00609238;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_00609280;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  *(Coroutine<void> **)this = this_00;
  co_await<bool>(__return_storage_ptr__,(Promise<bool> *)((long)coroutine._M_fr_ptr + 0x5b0));
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5b8) = 0;
  bVar1 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (!bVar1) {
    bVar1 = kj::_::PromiseAwaiter<bool>::await_resume(__return_storage_ptr__);
    if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
    local_48.value = (bool *)((long)coroutine._M_fr_ptr + 0x5ba);
    *local_48.value = bVar1;
    if (!bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
                (&local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++"
                 ,0x3b,FAILED,"resolved","_kjCondition,",&local_48);
      kj::_::Debug::Fault::fatal(&local_50);
    }
    __return_storage_ptr___00 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x3f0);
    co_await<void>(__return_storage_ptr___00,(Promise<void> *)((long)coroutine._M_fr_ptr + 0x5a8));
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5b8) = 1;
    bVar1 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr___00,(CoroutineBase *)this_00);
    if (!bVar1) {
      kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr___00);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x408) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x410));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase
                ((PromiseAwaiterBase *)__return_storage_ptr___00);
      kj::_::Coroutine<void>::fulfill(this_00,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x5b9));
      *(undefined8 *)coroutine._M_fr_ptr = 0;
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5b8) = 2;
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> simpleCoroutine(kj::Promise<T> result, kj::Promise<bool> dontThrow = true) {
  // TODO(cleanup): Storing the coroutine result in a variable to work around
  // https://developercommunity.visualstudio.com/t/certain-coroutines-cause-error-C7587:-/10311276,
  // which caused a compile error here. This was supposed to be resolved with version 17.9, but
  // appears to still be happening as of 17.9.6. Clean up once this has been fixed.
  auto resolved = co_await dontThrow;
  KJ_ASSERT(resolved);
  co_return co_await result;
}